

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * QUnicodeTables::detachAndConvertCase<QString>
                    (QString *__return_storage_ptr__,QString *str,QStringIterator it,Case which)

{
  char16_t cVar1;
  Data *pDVar2;
  ulong uVar3;
  const_iterator pQVar4;
  ulong uVar5;
  qsizetype qVar6;
  char cVar7;
  char32_t uc;
  char16_t *pcVar8;
  long lVar9;
  long in_FS_OFFSET;
  QSpan<unsigned_long,_18446744073709551615UL> indices;
  R_conflict2 RVar10;
  QStringView after;
  const_iterator local_58;
  ulong local_50;
  char16_t local_48 [4];
  undefined2 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = (str->d).d;
  (str->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).d = pDVar2;
  pcVar8 = (str->d).ptr;
  (str->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).ptr = pcVar8;
  qVar6 = (str->d).size;
  (str->d).size = 0;
  (__return_storage_ptr__->d).size = qVar6;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(__return_storage_ptr__,qVar6,KeepSize);
  }
  local_58 = it.i;
  pcVar8 = (char16_t *)(((long)it.pos - (long)it.i) + (long)(__return_storage_ptr__->d).ptr);
  do {
    pQVar4 = it.pos + 1;
    local_48 = (char16_t  [4])&DAT_aaaaaaaaaaaaaaaa;
    local_40 = 0xaaaa;
    cVar1 = (it.pos)->ucs;
    uc = (char32_t)(ushort)cVar1;
    if (((((cVar1 & 0xf800U) == 0xd800) && (uc = L'�', (cVar1 & 0xdc00U) == 0xd800)) &&
        (pQVar4 < it.e)) && ((pQVar4->ucs & 0xfc00U) == 0xdc00)) {
      uc = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pQVar4->ucs + L'\xfca02400';
      pQVar4 = it.pos + 2;
    }
    it.pos = pQVar4;
    RVar10 = fullConvertCase(uc,which);
    local_48 = RVar10.chars;
    cVar7 = RVar10.sz;
    local_40 = CONCAT11(local_40._1_1_,cVar7);
    if (cVar7 < '\x02') {
      *pcVar8 = RVar10.chars[0];
      pcVar8 = pcVar8 + 1;
    }
    else if ((cVar7 == '\x02') && (RVar10.chars[0] == *pcVar8)) {
      local_48[1] = RVar10.chars[1];
      pcVar8[1] = local_48[1];
      pcVar8 = pcVar8 + 2;
    }
    else {
      lVar9 = (long)pcVar8 - (long)(__return_storage_ptr__->d).ptr;
      uVar5 = lVar9 >> 1;
      uVar3 = (__return_storage_ptr__->d).size;
      qVar6 = uVar3 - uVar5;
      if (uVar5 <= uVar3) {
        if (0 < qVar6) {
          qVar6 = 1;
        }
        indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size = 1;
        indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_data = &local_50;
        after.m_size._0_1_ = cVar7;
        after.m_data = local_48;
        after.m_size._1_7_ = 0;
        local_50 = uVar5;
        replace_helper(__return_storage_ptr__,indices,qVar6,after);
      }
      pQVar4 = (const_iterator)(__return_storage_ptr__->d).ptr;
      pcVar8 = (char16_t *)((long)pQVar4 + (long)(char)local_40 * 2 + lVar9);
      it.e = pQVar4 + (__return_storage_ptr__->d).size;
      it.pos = (const_iterator)
               ((long)pQVar4 + (long)it.pos + ((long)(char)local_40 * 2 - (long)local_58) + -2);
      local_58 = pQVar4;
    }
  } while (it.pos < it.e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

Q_NEVER_INLINE
static QString detachAndConvertCase(T &str, QStringIterator it, QUnicodeTables::Case which)
{
    Q_ASSERT(!str.isEmpty());
    QString s = std::move(str);         // will copy if T is const QString
    QChar *pp = s.begin() + it.index(); // will detach if necessary

    do {
        const auto folded = fullConvertCase(it.next(), which);
        if (Q_UNLIKELY(folded.size() > 1)) {
            if (folded.chars[0] == *pp && folded.size() == 2) {
                // special case: only second actually changed (e.g. surrogate pairs),
                // avoid slow case
                ++pp;
                *pp++ = folded.chars[1];
            } else {
                // slow path: the string is growing
                qsizetype inpos = it.index() - 1;
                qsizetype outpos = pp - s.constBegin();

                s.replace(outpos, 1, reinterpret_cast<const QChar *>(folded.data()), folded.size());
                pp = const_cast<QChar *>(s.constBegin()) + outpos + folded.size();

                // Adjust the input iterator if we are performing an in-place conversion
                if constexpr (!std::is_const<T>::value)
                    it = QStringIterator(s.constBegin(), inpos + folded.size(), s.constEnd());
            }
        } else {
            *pp++ = folded.chars[0];
        }
    } while (it.hasNext());

    return s;
}